

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O2

Reals __thiscall Omega_h::matrices_to_symms(Omega_h *this,Reals *matrices,Int dim)

{
  void *extraout_RDX;
  Write<double> *this_00;
  Reals RVar1;
  Write<double> local_40;
  Write<double> local_30;
  Write<double> local_20;
  
  if (dim == 1) {
    this_00 = &local_40;
    Write<double>::Write(this_00,&matrices->write_);
    matrices_to_symms_dim<1>(this,(Reals *)this_00);
  }
  else if (dim == 2) {
    this_00 = &local_30;
    Write<double>::Write(this_00,&matrices->write_);
    matrices_to_symms_dim<2>(this,(Reals *)this_00);
  }
  else {
    if (dim != 3) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
           ,0x93);
    }
    this_00 = &local_20;
    Write<double>::Write(this_00,&matrices->write_);
    matrices_to_symms_dim<3>(this,(Reals *)this_00);
  }
  Write<double>::~Write(this_00);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals matrices_to_symms(Reals const matrices, Int const dim) {
  if (dim == 3) return matrices_to_symms_dim<3>(matrices);
  if (dim == 2) return matrices_to_symms_dim<2>(matrices);
  if (dim == 1) return matrices_to_symms_dim<1>(matrices);
  OMEGA_H_NORETURN(Reals());
}